

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arsenal.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
AfterburnerUtil::stringToDoubles
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,string *str)

{
  double val;
  stringstream sst;
  byte abStack_180 [360];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,str," ");
  std::__cxx11::stringstream::stringstream((stringstream *)&sst,(string *)&val,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&val);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::istream::_M_extract<double>((double *)&sst);
  while ((abStack_180[*(long *)(_sst + -0x18)] & 2) == 0) {
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&val);
    std::istream::_M_extract<double>((double *)&sst);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&sst);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> stringToDoubles(std::string str) {
    // Return a vector of doubles from the string "str". "str" should
    // be a string containing a line of data.
    // add a blank at the end so the last data will be read
    std::stringstream sst(str + " ");
    std::vector<double> valueList;
    double val;
    sst >> val;
    while (sst.eof() == false) {
        valueList.push_back(val);
        sst >> val;
    }
    return valueList;
}